

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# performance_test_image_function.cpp
# Opt level: O3

pair<double,_double>
Function_Template::template_GammaCorrection
          (GammaCorrectionForm2 GammaCorrection,string *namespaceName,uint32_t size)

{
  uint uVar1;
  uint uVar2;
  uint32_t uVar3;
  uint32_t i;
  uint uVar4;
  pair<double,_double> pVar5;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  image;
  TimerContainer timer;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  local_58;
  TimerContainer local_40;
  
  Test_Helper::uniformImages(&local_58,2,size,size);
  uVar1 = rand();
  uVar2 = rand();
  SetupFunction(namespaceName);
  Performance_Test::TimerContainer::TimerContainer(&local_40);
  uVar4 = 0;
  while( true ) {
    uVar3 = Test_Helper::runCount();
    if (uVar3 <= uVar4) break;
    Performance_Test::TimerContainer::start(&local_40);
    (*GammaCorrection)(local_58.
                       super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       local_58.
                       super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 1,(double)(uVar1 % 100) / 100.0,
                       (double)(uVar2 % 300) / 100.0);
    Performance_Test::TimerContainer::stop(&local_40);
    uVar4 = uVar4 + 1;
  }
  CleanupFunction(namespaceName);
  pVar5 = Performance_Test::BaseTimerContainer::mean(&local_40.super_BaseTimerContainer);
  Performance_Test::TimerContainer::~TimerContainer(&local_40);
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::~vector(&local_58);
  return pVar5;
}

Assistant:

std::pair < double, double > template_GammaCorrection( GammaCorrectionForm2 GammaCorrection, const std::string & namespaceName, uint32_t size )
    {
        std::vector < PenguinV_Image::Image > image = Performance_Test::uniformImages( 2, size, size );
        double a     = Performance_Test::randomValue <uint32_t>( 100 ) / 100.0;
        double gamma = Performance_Test::randomValue <uint32_t>( 300 ) / 100.0;

        TEST_FUNCTION_LOOP( GammaCorrection( image[0], image[1], a, gamma ), namespaceName )
    }